

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::SetCurrentBinaryDirectory(cmMakefile *this,string *dir)

{
  char *path;
  allocator local_39;
  string local_38;
  
  cmState::Snapshot::SetCurrentBinaryDirectory(&this->StateSnapshot,dir);
  path = cmState::Snapshot::GetCurrentBinaryDirectory(&this->StateSnapshot);
  cmsys::SystemTools::MakeDirectory(path);
  std::__cxx11::string::string((string *)&local_38,"CMAKE_CURRENT_BINARY_DIR",&local_39);
  AddDefinition(this,&local_38,path);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmMakefile::SetCurrentBinaryDirectory(const std::string& dir)
{
  this->StateSnapshot.SetCurrentBinaryDirectory(dir);
  const char* binDir = this->StateSnapshot.GetCurrentBinaryDirectory();
  cmSystemTools::MakeDirectory(binDir);
  this->AddDefinition("CMAKE_CURRENT_BINARY_DIR", binDir);
}